

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.cpp
# Opt level: O3

date_t duckdb::SubtractOperator::Operation<duckdb::date_t,int,duckdb::date_t>
                 (date_t left,int32_t right)

{
  OutOfRangeException *pOVar1;
  int iVar2;
  ulong uVar3;
  string local_40;
  
  uVar3 = (ulong)(uint)left.days;
  if ((left.days != -0x7fffffff) && (left.days != 0x7fffffff)) {
    uVar3 = (long)left.days - (long)right;
    iVar2 = (int)uVar3;
    if ((long)iVar2 != uVar3) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Date out of range","");
      OutOfRangeException::OutOfRangeException(pOVar1,&local_40);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((iVar2 == 0x7fffffff) || (iVar2 == -0x7fffffff)) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Date out of range","");
      OutOfRangeException::OutOfRangeException(pOVar1,&local_40);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return (date_t)(int32_t)uVar3;
}

Assistant:

date_t SubtractOperator::Operation(date_t left, int32_t right) {
	if (!Date::IsFinite(left)) {
		return left;
	}
	int32_t days;
	if (!TrySubtractOperator::Operation(left.days, right, days)) {
		throw OutOfRangeException("Date out of range");
	}

	date_t result(days);
	if (!Date::IsFinite(result)) {
		throw OutOfRangeException("Date out of range");
	}
	return result;
}